

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_encrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  int iVar1;
  long lVar2;
  int local_48;
  int local_44;
  int ret;
  int clen;
  uint8_t *dst;
  HMAC_CTX *hctx;
  EVP_CIPHER_CTX *cctx;
  _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb_local;
  ptls_buffer_t *buf_local;
  ptls_iovec_t src_local;
  
  src_local.base = (uint8_t *)src.len;
  buf_local = (ptls_buffer_t *)src.base;
  hctx = (HMAC_CTX *)0x0;
  dst = (uint8_t *)0x0;
  cctx = (EVP_CIPHER_CTX *)cb;
  cb_local = (_func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)buf;
  hctx = (HMAC_CTX *)EVP_CIPHER_CTX_new();
  if ((EVP_CIPHER_CTX *)hctx == (EVP_CIPHER_CTX *)0x0) {
    local_48 = 0x201;
  }
  else {
    dst = (uint8_t *)HMAC_CTX_new();
    if (dst == (uint8_t *)0x0) {
      local_48 = 0x201;
    }
    else {
      local_48 = ptls_buffer_reserve((ptls_buffer_t *)cb_local,(size_t)(src_local.base + 0x80));
      if (local_48 == 0) {
        _ret = (uchar *)(*(long *)cb_local + *(long *)(cb_local + 0x10));
        iVar1 = (*(code *)cctx)(_ret,_ret + 0x10,hctx,dst,1);
        if (iVar1 == 0) {
          local_48 = 0x203;
        }
        else {
          _ret = _ret + 0x20;
          iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)hctx,_ret,&local_44,(uchar *)buf_local,
                                    (int)src_local.base);
          if (iVar1 == 0) {
            local_48 = 0x203;
          }
          else {
            _ret = _ret + local_44;
            iVar1 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)hctx,_ret,&local_44);
            if (iVar1 == 0) {
              local_48 = 0x203;
            }
            else {
              _ret = _ret + local_44;
              iVar1 = HMAC_Update((HMAC_CTX *)dst,
                                  (uchar *)(*(long *)cb_local + *(long *)(cb_local + 0x10)),
                                  (long)_ret - (*(long *)cb_local + *(long *)(cb_local + 0x10)));
              if ((iVar1 == 0) || (iVar1 = HMAC_Final((HMAC_CTX *)dst,_ret,(uint *)0x0), iVar1 == 0)
                 ) {
                local_48 = 0x203;
              }
              else {
                lVar2 = HMAC_size(dst);
                _ret = _ret + lVar2;
                if ((uchar *)(*(long *)cb_local + *(long *)(cb_local + 8)) < _ret) {
                  __assert_fail("dst <= buf->base + buf->capacity",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/openssl.c"
                                ,0x532,
                                "int ptls_openssl_encrypt_ticket(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, HMAC_CTX *, int))"
                               );
                }
                *(uchar **)(cb_local + 0x10) =
                     _ret + (*(long *)(cb_local + 0x10) -
                            (*(long *)cb_local + *(long *)(cb_local + 0x10)));
                local_48 = 0;
              }
            }
          }
        }
      }
    }
  }
  if (hctx != (HMAC_CTX *)0x0) {
    cleanup_cipher_ctx((EVP_CIPHER_CTX *)hctx);
  }
  if (dst != (uint8_t *)0x0) {
    HMAC_CTX_free(dst);
  }
  return local_48;
}

Assistant:

int ptls_openssl_encrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!HMAC_Update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) || !HMAC_Final(hctx, dst, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += HMAC_size(hctx);

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        cleanup_cipher_ctx(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}